

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

object_class *
lsvm::object::new_class(package *pkg,symbol *name,object_class *super,uint16_t fields_count)

{
  object_class *poVar1;
  hashmap *phVar2;
  undefined6 in_register_0000000a;
  
  poVar1 = (object_class *)
           memory::allocate((CONCAT62(in_register_0000000a,fields_count) & 0xffffffff) * 8 + 0x28);
  poVar1->pkg = pkg;
  poVar1->name = name;
  poVar1->super = super;
  poVar1->fields_count = fields_count;
  phVar2 = hashmap::new_hashmap
                     (symbol::symbol_equals,symbol::symbol_hash,'\x01','\x03',3,100,7,0x2ac5);
  poVar1->methods = phVar2;
  if ((int)CONCAT62(in_register_0000000a,fields_count) != 0) {
    memset(poVar1 + 1,0,(ulong)fields_count << 3);
  }
  return poVar1;
}

Assistant:

object_class* new_class(package* pkg, symbol* name, object_class* super, uint16_t fields_count){
    object_class* cls = (object_class*)lsvm::memory::allocate(sizeof(object_class)+(fields_count*sizeof(symbol*)));
    cls->pkg = pkg;
    cls->name = name;
    cls->super = super;
    cls->fields_count = fields_count;
    cls->methods = lsvm::symbol::new_symbolmap();

    for(uint16_t i = 0; i<fields_count; ++i){
        cls->fields[i] = null;
    }

    return cls;
}